

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O0

long __thiscall glcts::anon_unknown_0::BasicBuiltinVariables::Run(BasicBuiltinVariables *this)

{
  bool bVar1;
  Vector<unsigned_int,_3> local_a8;
  Vector<unsigned_int,_3> local_9c;
  Vector<unsigned_int,_3> local_90;
  Vector<unsigned_int,_3> local_84;
  Vector<unsigned_int,_3> local_78;
  Vector<unsigned_int,_3> local_6c;
  Vector<unsigned_int,_3> local_60;
  Vector<unsigned_int,_3> local_54;
  Vector<unsigned_int,_3> local_48;
  Vector<unsigned_int,_3> local_3c;
  Vector<unsigned_int,_3> local_30;
  Vector<unsigned_int,_3> local_24;
  BasicBuiltinVariables *local_18;
  BasicBuiltinVariables *this_local;
  
  local_18 = this;
  tcu::Vector<unsigned_int,_3>::Vector(&local_24,0x40,1,1);
  tcu::Vector<unsigned_int,_3>::Vector(&local_30,8,1,1);
  bVar1 = RunIteration(this,&local_24,&local_30,false);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    tcu::Vector<unsigned_int,_3>::Vector(&local_3c,1,1,0x40);
    tcu::Vector<unsigned_int,_3>::Vector(&local_48,1,5,2);
    bVar1 = RunIteration(this,&local_3c,&local_48,true);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      tcu::Vector<unsigned_int,_3>::Vector(&local_54,1,1,4);
      tcu::Vector<unsigned_int,_3>::Vector(&local_60,2,2,2);
      bVar1 = RunIteration(this,&local_54,&local_60,false);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        tcu::Vector<unsigned_int,_3>::Vector(&local_6c,3,2,1);
        tcu::Vector<unsigned_int,_3>::Vector(&local_78,1,2,3);
        bVar1 = RunIteration(this,&local_6c,&local_78,true);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          tcu::Vector<unsigned_int,_3>::Vector(&local_84,2,4,2);
          tcu::Vector<unsigned_int,_3>::Vector(&local_90,2,4,1);
          bVar1 = RunIteration(this,&local_84,&local_90,false);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            tcu::Vector<unsigned_int,_3>::Vector(&local_9c,2,4,7);
            tcu::Vector<unsigned_int,_3>::Vector(&local_a8,2,1,4);
            bVar1 = RunIteration(this,&local_9c,&local_a8,true);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              this_local = (BasicBuiltinVariables *)0x0;
            }
            else {
              this_local = (BasicBuiltinVariables *)&DAT_ffffffffffffffff;
            }
          }
          else {
            this_local = (BasicBuiltinVariables *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (BasicBuiltinVariables *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (BasicBuiltinVariables *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (BasicBuiltinVariables *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (BasicBuiltinVariables *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!RunIteration(uvec3(64, 1, 1), uvec3(8, 1, 1), false))
			return ERROR;
		if (!RunIteration(uvec3(1, 1, 64), uvec3(1, 5, 2), true))
			return ERROR;
		if (!RunIteration(uvec3(1, 1, 4), uvec3(2, 2, 2), false))
			return ERROR;
		if (!RunIteration(uvec3(3, 2, 1), uvec3(1, 2, 3), true))
			return ERROR;
		if (!RunIteration(uvec3(2, 4, 2), uvec3(2, 4, 1), false))
			return ERROR;
		if (!RunIteration(uvec3(2, 4, 7), uvec3(2, 1, 4), true))
			return ERROR;
		return NO_ERROR;
	}